

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O2

void __thiscall QHttpThreadDelegate::startRequest(QHttpThreadDelegate *this)

{
  QHttpNetworkRequest *this_00;
  QHttpThreadDelegate *this_01;
  QHttpThreadDelegate QVar1;
  long lVar2;
  QNetworkAccessAuthenticationManager *this_02;
  QHttpNetworkConnection *this_03;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  quint16 port;
  ConnectionType connectionType;
  ProxyType PVar8;
  NetworkError NVar9;
  QNetworkAccessCache *this_04;
  QNetworkAccessCache **ppQVar10;
  CacheableObject *pCVar11;
  CacheableObject *pCVar12;
  QNetworkAccessCachedHttpConnection *this_05;
  qsizetype qVar13;
  QHttpNetworkReply *pQVar14;
  QHttpThreadDelegate *proxy;
  char *pcVar15;
  ConnectionType CVar16;
  QObject *this_06;
  long in_FS_OFFSET;
  QLatin1String QVar17;
  QObject local_158 [8];
  QObject local_150 [8];
  QObject local_148 [8];
  QObject local_140 [8];
  QObject local_138 [8];
  QObject local_130 [8];
  QObject local_128 [8];
  QObject local_120 [8];
  QObject local_118 [8];
  QObject local_110 [8];
  QObject local_108 [8];
  QObject local_100 [8];
  QObject local_f8 [8];
  QObject local_f0 [8];
  QObject local_e8 [8];
  QObject local_e0 [8];
  QObject local_d8 [8];
  QObject local_d0 [8];
  QNetworkAuthenticationCredential credential;
  QAuthenticator auth;
  QArrayDataPointer<char16_t> local_58;
  QUrl urlCopy;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = QThreadStorage<QNetworkAccessCache_*>::hasLocalData(&connections);
  if (!bVar5) {
    this_04 = (QNetworkAccessCache *)operator_new(0x30);
    *(undefined8 *)this_04 = 0;
    *(undefined8 *)(this_04 + 8) = 0;
    *(undefined8 *)(this_04 + 0x10) = 0;
    *(undefined8 *)(this_04 + 0x18) = 0;
    *(undefined8 *)(this_04 + 0x20) = 0;
    *(undefined8 *)(this_04 + 0x28) = 0;
    QNetworkAccessCache::QNetworkAccessCache(this_04);
    QThreadStorageData::set(&connections);
  }
  urlCopy.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QHttpNetworkRequest *)(this + 0x20);
  QHttpNetworkRequest::url((QHttpNetworkRequest *)&urlCopy);
  QUrl::scheme();
  QVar17.m_data = (char *)0x4;
  QVar17.m_size = (qsizetype)&credential;
  bVar5 = (bool)QString::startsWith(QVar17,0x23dd48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&credential);
  if (bVar5 == false) {
    QUrl::port((int)&urlCopy);
    QUrl::setPort((int)&urlCopy);
  }
  bVar6 = QHttpNetworkRequest::isHTTP2Allowed(this_00);
  bVar7 = QHttpNetworkRequest::isHTTP2Direct(this_00);
  connectionType = ConnectionTypeHTTP2Direct;
  if (!bVar7) {
    connectionType = (uint)bVar6;
  }
  if ((connectionType == ConnectionTypeHTTP2) && (this[0x10] == (QHttpThreadDelegate)0x0)) {
    bVar6 = QHttpNetworkRequest::isH2cAllowed(this_00);
    connectionType = (ConnectionType)bVar6;
  }
  bVar6 = QHttpNetworkRequest::isHTTP2Allowed(this_00);
  if ((bVar6) || (bVar6 = QHttpNetworkRequest::isHTTP2Direct(this_00), bVar6)) {
    if (this[0x10] == (QHttpThreadDelegate)0x1) {
      bVar6 = QHttpNetworkRequest::isHTTP2Direct(this_00);
      if (!bVar6) {
        credential.domain.d.d = (Data *)0x0;
        credential.domain.d.ptr = (char16_t *)0x0;
        credential.domain.d.size = 0;
        QByteArray::QByteArray((QByteArray *)&local_58,"h2",-1);
        QList<QByteArray>::emplaceBack<QByteArray>
                  ((QList<QByteArray> *)&credential,(QByteArray *)&local_58);
        QByteArray::QByteArray((QByteArray *)&auth,"http/1.1",-1);
        QList<QByteArray>::emplaceBack<QByteArray>
                  ((QList<QByteArray> *)&credential,(QByteArray *)&auth);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&auth);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
        QSslConfiguration::setAllowedNextProtocols
                  (*(QSslConfiguration **)(this + 0x18),(QList<QByteArray> *)&credential);
        QArrayDataPointer<QByteArray>::~QArrayDataPointer
                  ((QArrayDataPointer<QByteArray> *)&credential);
      }
      credential.domain.d.ptr = L"h2s";
      credential.domain.d.size = 3;
    }
    else if (bVar5 == false) {
      credential.domain.d.ptr = L"h2";
      credential.domain.d.size = 2;
    }
    else {
      credential.domain.d.ptr = L"unix+h2";
      credential.domain.d.size = 7;
    }
    local_58.size = 0;
    local_58.ptr = (char16_t *)0x0;
    local_58.d = (Data *)0x0;
    credential.domain.d.d = (Data *)0x0;
    QUrl::setScheme((QString *)&urlCopy);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&credential);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QHttpNetworkRequest::peerVerifyName((QString *)&local_58,this_00);
  if (bVar5 != false) {
    credential.domain.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    credential.domain.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    credential.domain.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QHttpNetworkRequest::fullLocalServerName(&credential.domain,this_00);
    if (credential.domain.d.size != 0) {
      QString::operator=((QString *)&local_58,(QString *)&credential);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&credential);
  }
  this_01 = this + 0x70;
  PVar8 = QNetworkProxy::type((QNetworkProxy *)this_01);
  if (PVar8 == NoProxy) {
    PVar8 = QNetworkProxy::type((QNetworkProxy *)(this + 0x68));
    if (PVar8 != NoProxy) {
      QHttpNetworkRequest::peerVerifyName((QString *)&auth,this_00);
      makeCacheKey((QByteArray *)&credential,&urlCopy,(QNetworkProxy *)(this + 0x68),
                   (QString *)&auth);
      pDVar3 = *(Data **)(this + 0x138);
      pcVar4 = *(char16_t **)(this + 0x140);
      *(Data **)(this + 0x138) = credential.domain.d.d;
      *(char16_t **)(this + 0x140) = credential.domain.d.ptr;
      qVar13 = *(qsizetype *)(this + 0x148);
      *(qsizetype *)(this + 0x148) = credential.domain.d.size;
      credential.domain.d.d = pDVar3;
      credential.domain.d.ptr = pcVar4;
      credential.domain.d.size = qVar13;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&credential);
      goto LAB_001f8fe0;
    }
    QHttpNetworkRequest::peerVerifyName((QString *)&auth,this_00);
    proxy = (QHttpThreadDelegate *)0x0;
  }
  else {
    QHttpNetworkRequest::peerVerifyName((QString *)&auth,this_00);
    proxy = this_01;
  }
  makeCacheKey((QByteArray *)&credential,&urlCopy,(QNetworkProxy *)proxy,(QString *)&auth);
  pDVar3 = *(Data **)(this + 0x138);
  pcVar4 = *(char16_t **)(this + 0x140);
  *(Data **)(this + 0x138) = credential.domain.d.d;
  *(char16_t **)(this + 0x140) = credential.domain.d.ptr;
  qVar13 = *(qsizetype *)(this + 0x148);
  *(qsizetype *)(this + 0x148) = credential.domain.d.size;
  credential.domain.d.d = pDVar3;
  credential.domain.d.ptr = pcVar4;
  credential.domain.d.size = qVar13;
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&credential);
LAB_001f8fe0:
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&auth);
  ppQVar10 = QThreadStorage<QNetworkAccessCache_*>::localData(&connections);
  pCVar11 = QNetworkAccessCache::requestEntryNow
                      ((QNetworkAccessCache *)*ppQVar10,(QByteArray *)(this + 0x138));
  pCVar12 = pCVar11;
  if (pCVar11 != (CacheableObject *)0x0) {
    pCVar12 = (CacheableObject *)&pCVar11[-1].expires;
  }
  *(CacheableObject **)(this + 0x130) = pCVar12;
  if (pCVar11 == (CacheableObject *)0x0) {
    credential.domain.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    credential.domain.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    credential.domain.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QUrl::host(&credential,&urlCopy,0x7f00000);
    if (bVar5 != false) {
      auth.d = (QAuthenticatorPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QHttpNetworkRequest::fullLocalServerName((QString *)&auth,this_00);
      QString::operator=(&credential.domain,(QString *)&auth);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&auth);
    }
    this_05 = (QNetworkAccessCachedHttpConnection *)operator_new(0x40);
    qVar13 = QHttp1Configuration::numberOfConnectionsPerHost((QHttp1Configuration *)(this + 0x110));
    port = QUrl::port((int)&urlCopy);
    QNetworkAccessCachedHttpConnection::QNetworkAccessCachedHttpConnection
              (this_05,(quint16)qVar13,&credential.domain,port,(bool)this[0x10],bVar5,connectionType
              );
    *(QNetworkAccessCachedHttpConnection **)(this + 0x130) = this_05;
    if (connectionType - ConnectionTypeHTTP2 < 2) {
      QHttpNetworkConnection::setHttp2Parameters
                ((QHttpNetworkConnection *)this_05,(QHttp2Configuration *)(this + 0x118));
      this_05 = *(QNetworkAccessCachedHttpConnection **)(this + 0x130);
    }
    if (this[0x10] == (QHttpThreadDelegate)0x1) {
      QHttpNetworkConnection::setSslConfiguration
                ((QHttpNetworkConnection *)this_05,*(QSslConfiguration **)(this + 0x18));
      this_05 = *(QNetworkAccessCachedHttpConnection **)(this + 0x130);
    }
    QHttpNetworkConnection::setTransparentProxy
              ((QHttpNetworkConnection *)this_05,(QNetworkProxy *)this_01);
    QHttpNetworkConnection::setCacheProxy
              (*(QHttpNetworkConnection **)(this + 0x130),(QNetworkProxy *)(this + 0x68));
    this_03 = *(QHttpNetworkConnection **)(this + 0x130);
    QHttpNetworkRequest::peerVerifyName((QString *)&auth,this_00);
    QHttpNetworkConnection::setPeerVerifyName(this_03,(QString *)&auth);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&auth);
    ppQVar10 = QThreadStorage<QNetworkAccessCache_*>::localData(&connections);
    pCVar12 = *(CacheableObject **)(this + 0x130);
    if (pCVar12 != (CacheableObject *)0x0) {
      pCVar12 = (CacheableObject *)&(pCVar12->key).d.ptr;
    }
    QNetworkAccessCache::addEntry
              ((QNetworkAccessCache *)*ppQVar10,(QByteArray *)(this + 0x138),pCVar12,
               *(qint64 *)(this + 0x90));
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&credential);
  }
  else {
    bVar5 = QHttpNetworkRequest::withCredentials(this_00);
    if (bVar5) {
      credential.password.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      credential.password.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      credential.password.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      credential.user.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      credential.user.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      credential.domain.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      credential.user.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      credential.domain.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      credential.domain.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      this_02 = *(QNetworkAccessAuthenticationManager **)(this + 0x78);
      QHttpNetworkRequest::url((QHttpNetworkRequest *)&auth);
      QNetworkAccessAuthenticationManager::fetchCachedCredentials
                (&credential,this_02,(QUrl *)&auth,(QAuthenticator *)0x0);
      QUrl::~QUrl((QUrl *)&auth);
      if ((credential.user.d.size != 0) && (credential.password.d.size != 0)) {
        auth.d = (QAuthenticatorPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QAuthenticator::QAuthenticator(&auth);
        QAuthenticator::setUser(&auth,&credential.user);
        QAuthenticator::setPassword(&auth,&credential.password);
        QHttpNetworkConnectionPrivate::copyCredentials
                  (*(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0x130) + 8),-1,&auth,false);
        QAuthenticator::~QAuthenticator(&auth);
      }
      QNetworkAuthenticationCredential::~QNetworkAuthenticationCredential(&credential);
    }
  }
  pQVar14 = QHttpNetworkConnection::sendRequest(*(QHttpNetworkConnection **)(this + 0x130),this_00);
  *(QHttpNetworkReply **)(this + 0x150) = pQVar14;
  QObject::setParent(&pQVar14->super_QObject);
  if (this[0x88] == (QHttpThreadDelegate)0x1) {
    QObject::connect(local_d0,*(char **)(this + 0x150),(QObject *)"2headerChanged()",(char *)this,
                     0x24f5b0);
    QMetaObject::Connection::~Connection((Connection *)local_d0);
    QObject::connect(local_d8,*(char **)(this + 0x150),(QObject *)"2finished()",(char *)this,
                     0x24f5d0);
    QMetaObject::Connection::~Connection((Connection *)local_d8);
    QObject::connect(local_e0,*(char **)(this + 0x150),
                     (QObject *)"2finishedWithError(QNetworkReply::NetworkError,QString)",
                     (char *)this,0x24f623);
    QMetaObject::Connection::~Connection((Connection *)local_e0);
    QObject::connect(local_e8,*(char **)(this + 0x150),
                     (QObject *)"2authenticationRequired(QHttpNetworkRequest,QAuthenticator*)",
                     (char *)this,0x24f6a7);
    QMetaObject::Connection::~Connection((Connection *)local_e8);
    pcVar15 = *(char **)(this + 0x150);
    CVar16 = 0x24f72f;
    this_06 = local_f0;
  }
  else {
    QObject::connect(local_f8,*(char **)(this + 0x150),(QObject *)"2socketStartedConnecting()",
                     (char *)this,0x24f77a);
    QMetaObject::Connection::~Connection((Connection *)local_f8);
    QObject::connect(local_100,*(char **)(this + 0x150),(QObject *)"2requestSent()",(char *)this,
                     0x24f795);
    QMetaObject::Connection::~Connection((Connection *)local_100);
    QObject::connect(local_108,*(char **)(this + 0x150),(QObject *)"2headerChanged()",(char *)this,
                     0x24f7a4);
    QMetaObject::Connection::~Connection((Connection *)local_108);
    QObject::connect(local_110,*(char **)(this + 0x150),(QObject *)"2finished()",(char *)this,
                     0x24f7b9);
    QMetaObject::Connection::~Connection((Connection *)local_110);
    QObject::connect(local_118,*(char **)(this + 0x150),
                     (QObject *)"2finishedWithError(QNetworkReply::NetworkError,QString)",
                     (char *)this,0x24f7c9);
    QMetaObject::Connection::~Connection((Connection *)local_118);
    QObject::connect(local_120,*(char **)(this + 0x150),(QObject *)"2readyRead()",(char *)this,
                     0x24f805);
    QMetaObject::Connection::~Connection((Connection *)local_120);
    QObject::connect(local_128,*(char **)(this + 0x150),
                     (QObject *)"2dataReadProgress(qint64,qint64)",(char *)this,0x24f837);
    QMetaObject::Connection::~Connection((Connection *)local_128);
    QObject::connect(local_130,*(char **)(this + 0x150),(QObject *)"2encrypted()",(char *)this,
                     0x24f869);
    QMetaObject::Connection::~Connection((Connection *)local_130);
    QObject::connect(local_138,*(char **)(this + 0x150),(QObject *)"2sslErrors(QList<QSslError>)",
                     (char *)this,0x24f87a);
    QMetaObject::Connection::~Connection((Connection *)local_138);
    QObject::connect(local_140,*(char **)(this + 0x150),
                     (QObject *)
                     "2preSharedKeyAuthenticationRequired(QSslPreSharedKeyAuthenticator*)",
                     (char *)this,0x24f89b);
    QMetaObject::Connection::~Connection((Connection *)local_140);
    QObject::connect(local_148,*(char **)(this + 0x150),
                     (QObject *)"2authenticationRequired(QHttpNetworkRequest,QAuthenticator*)",
                     (char *)this,0x24f66a);
    QMetaObject::Connection::~Connection((Connection *)local_148);
    pcVar15 = *(char **)(this + 0x150);
    this_06 = local_150;
    CVar16 = 0x24f6f3;
  }
  QObject::connect(this_06,pcVar15,
                   (QObject *)"2proxyAuthenticationRequired(QNetworkProxy,QAuthenticator*)",
                   (char *)this,CVar16);
  QMetaObject::Connection::~Connection((Connection *)this_06);
  QObject::connect(local_158,*(char **)(this + 0x150),
                   (QObject *)"2cacheCredentials(QHttpNetworkRequest,QAuthenticator*)",(char *)this,
                   0x24f91a);
  QMetaObject::Connection::~Connection((Connection *)local_158);
  NVar9 = QHttpNetworkReply::errorCode(*(QHttpNetworkReply **)(this + 0x150));
  if (NVar9 != NoError) {
    QVar1 = this[0x88];
    NVar9 = QHttpNetworkReply::errorCode(*(QHttpNetworkReply **)(this + 0x150));
    if (QVar1 == (QHttpThreadDelegate)0x1) {
      QHttpNetworkReply::errorString(&credential.domain,*(QHttpNetworkReply **)(this + 0x150));
      synchronousFinishedWithErrorSlot(this,NVar9,&credential.domain);
    }
    else {
      QHttpNetworkReply::errorString(&credential.domain,*(QHttpNetworkReply **)(this + 0x150));
      finishedWithErrorSlot(this,NVar9,&credential.domain);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&credential);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QUrl::~QUrl(&urlCopy);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpThreadDelegate::startRequest()
{
#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::startRequest() thread=" << QThread::currentThreadId();
#endif
    // Check QThreadStorage for the QNetworkAccessCache
    // If not there, create this connection cache
    if (!connections.hasLocalData()) {
        connections.setLocalData(new QNetworkAccessCache());
    }

    // check if we have an open connection to this host
    QUrl urlCopy = httpRequest.url();
    const bool isLocalSocket = urlCopy.scheme().startsWith("unix"_L1);
    if (!isLocalSocket)
        urlCopy.setPort(urlCopy.port(ssl ? 443 : 80));

    QHttpNetworkConnection::ConnectionType connectionType
        = httpRequest.isHTTP2Allowed() ? QHttpNetworkConnection::ConnectionTypeHTTP2
                                       : QHttpNetworkConnection::ConnectionTypeHTTP;
    if (httpRequest.isHTTP2Direct()) {
        Q_ASSERT(!httpRequest.isHTTP2Allowed());
        connectionType = QHttpNetworkConnection::ConnectionTypeHTTP2Direct;
    }

    // Use HTTP/1.1 if h2c is not allowed and we would otherwise choose to use it
    if (!ssl && connectionType == QHttpNetworkConnection::ConnectionTypeHTTP2
        && !httpRequest.isH2cAllowed()) {
        connectionType = QHttpNetworkConnection::ConnectionTypeHTTP;
    }

#if QT_CONFIG(ssl)
    // See qnetworkreplyhttpimpl, delegate's initialization code.
    Q_ASSERT(!ssl || incomingSslConfiguration.data());
#endif // QT_CONFIG(ssl)

    const bool isH2 = httpRequest.isHTTP2Allowed() || httpRequest.isHTTP2Direct();
    if (isH2) {
#if QT_CONFIG(ssl)
        if (ssl) {
            if (!httpRequest.isHTTP2Direct()) {
                QList<QByteArray> protocols;
                protocols << QSslConfiguration::ALPNProtocolHTTP2
                          << QSslConfiguration::NextProtocolHttp1_1;
                incomingSslConfiguration->setAllowedNextProtocols(protocols);
            }
            urlCopy.setScheme(QStringLiteral("h2s"));
        } else
#endif // QT_CONFIG(ssl)
        {
            if (isLocalSocket)
                urlCopy.setScheme(QStringLiteral("unix+h2"));
            else
                urlCopy.setScheme(QStringLiteral("h2"));
        }
    }

    QString extraData = httpRequest.peerVerifyName();
    if (isLocalSocket) {
        if (QString path = httpRequest.fullLocalServerName(); !path.isEmpty())
            extraData = path;
    }

#ifndef QT_NO_NETWORKPROXY
    if (transparentProxy.type() != QNetworkProxy::NoProxy)
        cacheKey = makeCacheKey(urlCopy, &transparentProxy, httpRequest.peerVerifyName());
    else if (cacheProxy.type() != QNetworkProxy::NoProxy)
        cacheKey = makeCacheKey(urlCopy, &cacheProxy, httpRequest.peerVerifyName());
    else
#endif
        cacheKey = makeCacheKey(urlCopy, nullptr, httpRequest.peerVerifyName());

    // the http object is actually a QHttpNetworkConnection
    httpConnection = static_cast<QNetworkAccessCachedHttpConnection *>(connections.localData()->requestEntryNow(cacheKey));
    if (!httpConnection) {

        QString host = urlCopy.host();
        // Update the host if a unix socket path or named pipe is used:
        if (isLocalSocket) {
            if (QString path = httpRequest.fullLocalServerName(); !path.isEmpty())
                host = path;
        }

        // no entry in cache; create an object
        // the http object is actually a QHttpNetworkConnection
        httpConnection = new QNetworkAccessCachedHttpConnection(
                http1Parameters.numberOfConnectionsPerHost(), host, urlCopy.port(), ssl,
                isLocalSocket, connectionType);
        if (connectionType == QHttpNetworkConnection::ConnectionTypeHTTP2
            || connectionType == QHttpNetworkConnection::ConnectionTypeHTTP2Direct) {
            httpConnection->setHttp2Parameters(http2Parameters);
        }
#ifndef QT_NO_SSL
        // Set the QSslConfiguration from this QNetworkRequest.
        if (ssl)
            httpConnection->setSslConfiguration(*incomingSslConfiguration);
#endif

#ifndef QT_NO_NETWORKPROXY
        httpConnection->setTransparentProxy(transparentProxy);
        httpConnection->setCacheProxy(cacheProxy);
#endif
        httpConnection->setPeerVerifyName(httpRequest.peerVerifyName());
        // cache the QHttpNetworkConnection corresponding to this cache key
        connections.localData()->addEntry(cacheKey, httpConnection, connectionCacheExpiryTimeoutSeconds);
    } else {
        if (httpRequest.withCredentials()) {
            QNetworkAuthenticationCredential credential = authenticationManager->fetchCachedCredentials(httpRequest.url(), nullptr);
            if (!credential.user.isEmpty() && !credential.password.isEmpty()) {
                QAuthenticator auth;
                auth.setUser(credential.user);
                auth.setPassword(credential.password);
                httpConnection->d_func()->copyCredentials(-1, &auth, false);
            }
        }
    }

    // Send the request to the connection
    httpReply = httpConnection->sendRequest(httpRequest);
    httpReply->setParent(this);

    // Connect the reply signals that we need to handle and then forward
    if (synchronous) {
        connect(httpReply,SIGNAL(headerChanged()), this, SLOT(synchronousHeaderChangedSlot()));
        connect(httpReply,SIGNAL(finished()), this, SLOT(synchronousFinishedSlot()));
        connect(httpReply,SIGNAL(finishedWithError(QNetworkReply::NetworkError,QString)),
                this, SLOT(synchronousFinishedWithErrorSlot(QNetworkReply::NetworkError,QString)));

        connect(httpReply, SIGNAL(authenticationRequired(QHttpNetworkRequest,QAuthenticator*)),
                this, SLOT(synchronousAuthenticationRequiredSlot(QHttpNetworkRequest,QAuthenticator*)));
#ifndef QT_NO_NETWORKPROXY
        connect(httpReply, SIGNAL(proxyAuthenticationRequired(QNetworkProxy,QAuthenticator*)),
                this, SLOT(synchronousProxyAuthenticationRequiredSlot(QNetworkProxy,QAuthenticator*)));
#endif

        // Don't care about ignored SSL errors for now in the synchronous HTTP case.
    } else if (!synchronous) {
        connect(httpReply,SIGNAL(socketStartedConnecting()), this, SIGNAL(socketStartedConnecting()));
        connect(httpReply,SIGNAL(requestSent()), this, SIGNAL(requestSent()));
        connect(httpReply,SIGNAL(headerChanged()), this, SLOT(headerChangedSlot()));
        connect(httpReply,SIGNAL(finished()), this, SLOT(finishedSlot()));
        connect(httpReply,SIGNAL(finishedWithError(QNetworkReply::NetworkError,QString)),
                this, SLOT(finishedWithErrorSlot(QNetworkReply::NetworkError,QString)));
        // some signals are only interesting when normal asynchronous style is used
        connect(httpReply,SIGNAL(readyRead()), this, SLOT(readyReadSlot()));
        connect(httpReply,SIGNAL(dataReadProgress(qint64,qint64)), this, SLOT(dataReadProgressSlot(qint64,qint64)));
#ifndef QT_NO_SSL
        connect(httpReply,SIGNAL(encrypted()), this, SLOT(encryptedSlot()));
        connect(httpReply,SIGNAL(sslErrors(QList<QSslError>)), this, SLOT(sslErrorsSlot(QList<QSslError>)));
        connect(httpReply,SIGNAL(preSharedKeyAuthenticationRequired(QSslPreSharedKeyAuthenticator*)),
                this, SLOT(preSharedKeyAuthenticationRequiredSlot(QSslPreSharedKeyAuthenticator*)));
#endif

        // In the asynchronous HTTP case we can just forward those signals
        // Connect the reply signals that we can directly forward
        connect(httpReply, SIGNAL(authenticationRequired(QHttpNetworkRequest,QAuthenticator*)),
                this, SIGNAL(authenticationRequired(QHttpNetworkRequest,QAuthenticator*)));
#ifndef QT_NO_NETWORKPROXY
        connect(httpReply, SIGNAL(proxyAuthenticationRequired(QNetworkProxy,QAuthenticator*)),
                this, SIGNAL(proxyAuthenticationRequired(QNetworkProxy,QAuthenticator*)));
#endif
    }

    connect(httpReply, SIGNAL(cacheCredentials(QHttpNetworkRequest,QAuthenticator*)),
            this, SLOT(cacheCredentialsSlot(QHttpNetworkRequest,QAuthenticator*)));
    if (httpReply->errorCode() != QNetworkReply::NoError) {
        if (synchronous)
            synchronousFinishedWithErrorSlot(httpReply->errorCode(), httpReply->errorString());
        else
            finishedWithErrorSlot(httpReply->errorCode(), httpReply->errorString());
    }
}